

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O2

int bson_compare(bson_t *bson,bson_t *other)

{
  int iVar1;
  uint uVar2;
  bson_impl_alloc_t *impl;
  uint8_t *puVar3;
  ulong uVar4;
  ulong __n;
  ulong __n_00;
  long lVar5;
  uint8_t *puVar6;
  
  if ((bson->flags & 1) == 0) {
    puVar6 = (uint8_t *)(**(long **)(bson->padding + 0x10) + *(long *)(bson->padding + 0x20));
  }
  else {
    puVar6 = bson->padding;
  }
  __n_00 = (ulong)(bson->len - 4);
  if ((other->flags & 1) == 0) {
    puVar3 = (uint8_t *)(**(long **)(other->padding + 0x10) + *(long *)(other->padding + 0x20));
  }
  else {
    puVar3 = other->padding;
  }
  if (bson->len == other->len) {
    iVar1 = memcmp(puVar6 + 4,puVar3 + 4,__n_00);
    return iVar1;
  }
  uVar4 = (ulong)(other->len - 4);
  __n = uVar4;
  if (__n_00 < uVar4) {
    __n = __n_00;
  }
  iVar1 = memcmp(puVar6 + 4,puVar3 + 4,__n);
  lVar5 = __n_00 - uVar4;
  if (iVar1 != 0) {
    lVar5 = (long)iVar1;
  }
  uVar2 = 0xffffffff;
  if (-1 < lVar5) {
    uVar2 = (uint)(0 < lVar5);
  }
  return uVar2;
}

Assistant:

int
bson_compare (const bson_t *bson, const bson_t *other)
{
   const uint8_t *data1;
   const uint8_t *data2;
   size_t len1;
   size_t len2;
   int64_t ret;

   data1 = _bson_data (bson) + 4;
   len1 = bson->len - 4;

   data2 = _bson_data (other) + 4;
   len2 = other->len - 4;

   if (len1 == len2) {
      return memcmp (data1, data2, len1);
   }

   ret = memcmp (data1, data2, BSON_MIN (len1, len2));

   if (ret == 0) {
      ret = (int64_t) (len1 - len2);
   }

   return (ret < 0) ? -1 : (ret > 0);
}